

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O3

TRUST_TOKEN_METHOD * TRUST_TOKEN_pst_v1_pmb(void)

{
  return &TRUST_TOKEN_pst_v1_pmb::kMethod;
}

Assistant:

const TRUST_TOKEN_METHOD *TRUST_TOKEN_pst_v1_pmb(void) {
  static const TRUST_TOKEN_METHOD kMethod = {
      pmbtoken_pst1_generate_key,
      pmbtoken_pst1_derive_key_from_secret,
      pmbtoken_pst1_client_key_from_bytes,
      pmbtoken_pst1_issuer_key_from_bytes,
      pmbtoken_pst1_blind,
      pmbtoken_pst1_sign,
      pmbtoken_pst1_unblind,
      pmbtoken_pst1_read,
      1, /* has_private_metadata */
      3, /* max_keys */
      0, /* has_srr */
  };
  return &kMethod;
}